

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode randit(Curl_easy *data,uint *rnd,_Bool env_override)

{
  CURLcode CVar1;
  _Bool env_override_local;
  uint *rnd_local;
  Curl_easy *data_local;
  
  CVar1 = Curl_ssl_random(data,(uchar *)rnd,4);
  return CVar1;
}

Assistant:

static CURLcode randit(struct Curl_easy *data, unsigned int *rnd,
                       bool env_override)
{
#ifdef DEBUGBUILD
  if(env_override) {
    char *force_entropy = getenv("CURL_ENTROPY");
    if(force_entropy) {
      static unsigned int randseed;
      static bool seeded = FALSE;

      if(!seeded) {
        unsigned int seed = 0;
        size_t elen = strlen(force_entropy);
        size_t clen = sizeof(seed);
        size_t min = elen < clen ? elen : clen;
        memcpy((char *)&seed, force_entropy, min);
        randseed = ntohl(seed);
        seeded = TRUE;
      }
      else
        randseed++;
      *rnd = randseed;
      return CURLE_OK;
    }
  }
#else
  (void)env_override;
#endif

  /* data may be NULL! */
  return _random(data, (unsigned char *)rnd, sizeof(*rnd));
}